

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_pass.h
# Opt level: O3

void __thiscall
mocker::PromoteGlobalVariables::PromoteGlobalVariables(PromoteGlobalVariables *this,Module *module)

{
  (this->super_ModulePass).module = module;
  (this->super_ModulePass).super_OptPass._vptr_OptPass =
       (_func_int **)&PTR__PromoteGlobalVariables_001eb4f0;
  (this->funcGlobalVar).globalVarUses._M_h._M_buckets =
       &(this->funcGlobalVar).globalVarUses._M_h._M_single_bucket;
  (this->funcGlobalVar).globalVarUses._M_h._M_bucket_count = 1;
  (this->funcGlobalVar).globalVarUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->funcGlobalVar).globalVarUses._M_h._M_element_count = 0;
  (this->funcGlobalVar).globalVarUses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->funcGlobalVar).globalVarUses._M_h._M_rehash_policy._M_next_resize = 0;
  (this->funcGlobalVar).globalVarUses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->funcGlobalVar).globalVarDefs._M_h._M_buckets =
       &(this->funcGlobalVar).globalVarDefs._M_h._M_single_bucket;
  (this->funcGlobalVar).globalVarDefs._M_h._M_bucket_count = 1;
  (this->funcGlobalVar).globalVarDefs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->funcGlobalVar).globalVarDefs._M_h._M_element_count = 0;
  (this->funcGlobalVar).globalVarDefs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->funcGlobalVar).globalVarDefs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->funcGlobalVar).globalVarDefs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->funcGlobalVar).pureFuncs._M_h._M_buckets =
       &(this->funcGlobalVar).pureFuncs._M_h._M_single_bucket;
  (this->funcGlobalVar).pureFuncs._M_h._M_bucket_count = 1;
  (this->funcGlobalVar).pureFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->funcGlobalVar).pureFuncs._M_h._M_element_count = 0;
  (this->funcGlobalVar).pureFuncs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->funcGlobalVar).pureFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->funcGlobalVar).pureFuncs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit ModulePass(ir::Module &module) : module(module) {}